

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int push_change_cipher_spec(ptls_t *tls,ptls_buffer_t *sendbuf)

{
  size_t sVar1;
  size_t body_size;
  size_t local_30;
  size_t body_start;
  size_t capacity;
  ptls_buffer_t *ppStack_18;
  int ret;
  ptls_buffer_t *sendbuf_local;
  ptls_t *tls_local;
  
  capacity._4_4_ = 0;
  if (((byte)tls->field_0x160 >> 2 & 1) != 0) {
    capacity._1_1_ = 0x14;
    capacity._2_1_ = 3;
    capacity._3_1_ = 3;
    ppStack_18 = sendbuf;
    sendbuf_local = (ptls_buffer_t *)tls;
    capacity._4_4_ = ptls_buffer__do_pushv(sendbuf,(void *)((long)&capacity + 1),3);
    if (capacity._4_4_ == 0) {
      body_start = 2;
      capacity._4_4_ = ptls_buffer__do_pushv(ppStack_18,"",2);
      if (capacity._4_4_ == 0) {
        local_30 = ppStack_18->off;
        body_size._7_1_ = 1;
        capacity._4_4_ = ptls_buffer__do_pushv(ppStack_18,(void *)((long)&body_size + 7),1);
        if (capacity._4_4_ == 0) {
          sVar1 = ppStack_18->off;
          for (; body_start != 0; body_start = body_start - 1) {
            ppStack_18->base[local_30 - body_start] =
                 (uint8_t)(sVar1 - local_30 >> (((char)body_start + -1) * '\b' & 0x3fU));
          }
          *(byte *)&sendbuf_local[0xb].base = *(byte *)&sendbuf_local[0xb].base & 0xfb;
        }
      }
    }
  }
  return capacity._4_4_;
}

Assistant:

static int push_change_cipher_spec(ptls_t *tls, ptls_buffer_t *sendbuf)
{
    int ret = 0;

    if (!tls->send_change_cipher_spec)
        goto Exit;
    buffer_push_record(sendbuf, PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC, { ptls_buffer_push(sendbuf, 1); });
    tls->send_change_cipher_spec = 0;
Exit:
    return ret;
}